

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

void boost::filesystem::detail::copy_file(path *from,path *to,copy_option option,error_code *ec)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *__buf;
  int *piVar5;
  ssize_t sVar6;
  ssize_t sVar7;
  long lVar8;
  allocator<char> local_116;
  allocator<char> local_115;
  undefined4 local_114;
  error_code *local_110;
  path *local_108;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  stat64 local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,(from->m_pathname)._M_dataplus._M_p,&local_115);
  local_108 = to;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,(to->m_pathname)._M_dataplus._M_p,&local_116);
  __buf = operator_new__(0x8000);
  iVar1 = open64((char *)local_100[0],0);
  if (iVar1 < 0) {
LAB_0010bc9e:
    operator_delete__(__buf);
  }
  else {
    iVar2 = stat64((char *)local_100[0],&local_c0);
    if (iVar2 != 0) {
      close(iVar1);
      goto LAB_0010bc9e;
    }
    iVar2 = open64((char *)local_e0[0],(uint)(option == fail_if_exists) << 7 | 0x241,
                   (ulong)local_c0.st_mode);
    local_110 = ec;
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      close(iVar1);
      *piVar5 = iVar2;
      ec = local_110;
      goto LAB_0010bc9e;
    }
    while( true ) {
      sVar6 = read(iVar1,__buf,0x8000);
      if (sVar6 < 1) break;
      lVar8 = 0;
      do {
        if (sVar6 - lVar8 == 0 || sVar6 < lVar8) {
          __assert_fail("sz_read - sz_write > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                        ,0x1ca,
                        "bool (anonymous namespace)::copy_file_api(const std::string &, const std::string &, bool)"
                       );
        }
        sVar7 = write(iVar2,(void *)((long)__buf + lVar8),sVar6 - lVar8);
        if (sVar7 < 0) {
          local_114 = 0;
          goto LAB_0010bd91;
        }
        if (sVar7 == 0) {
          __assert_fail("sz > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                        ,0x1d5,
                        "bool (anonymous namespace)::copy_file_api(const std::string &, const std::string &, bool)"
                       );
        }
        lVar8 = lVar8 + sVar7;
      } while (lVar8 < sVar6);
    }
    local_114 = (undefined4)CONCAT71((int7)((ulong)sVar6 >> 8),sVar6 == 0);
LAB_0010bd91:
    uVar3 = close(iVar1);
    ec = local_110;
    uVar4 = close(iVar2);
    operator_delete__(__buf);
    iVar1 = 0;
    if (((byte)local_114 & -1 < (int)(uVar4 | uVar3)) != 0) goto LAB_0010bcad;
  }
  piVar5 = __errno_location();
  iVar1 = *piVar5;
LAB_0010bcad:
  anon_unknown.dwarf_59d9::error(iVar1,from,local_108,ec,"boost::filesystem::copy_file");
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy_file(const path& from, const path& to, copy_option option, error_code* ec)
  {
    error(!BOOST_COPY_FILE(from.c_str(), to.c_str(),
      option == fail_if_exists) ? BOOST_ERRNO : 0,
        from, to, ec, "boost::filesystem::copy_file");
  }